

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O1

SQClosure * SQClosure::Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQClosure *this;
  long lVar3;
  long lVar4;
  
  this = (SQClosure *)sq_vm_malloc((func->_ndefaultparams + func->_noutervalues) * 0x10 + 0x60);
  SQClosure(this,ss,func);
  this->_outervalues = (SQObjectPtr *)(this + 1);
  this->_defaultparams =
       (SQObjectPtr *)
       (&this[1].super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted + func->_noutervalues * 2
       );
  this->_root = root;
  pSVar1 = &(root->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  if (0 < func->_noutervalues) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pSVar2 = this->_outervalues;
      *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar3) = 0;
      *(undefined4 *)((long)pSVar2 + lVar3 + -8) = 0x1000001;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < func->_noutervalues);
  }
  if (0 < func->_ndefaultparams) {
    lVar3 = 8;
    lVar4 = 0;
    do {
      pSVar2 = this->_defaultparams;
      *(undefined8 *)((long)&(pSVar2->super_SQObject)._type + lVar3) = 0;
      *(undefined4 *)((long)pSVar2 + lVar3 + -8) = 0x1000001;
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar4 < func->_ndefaultparams);
  }
  return this;
}

Assistant:

static SQClosure *Create(SQSharedState *ss,SQFunctionProto *func,SQWeakRef *root){
        SQInteger size = _CALC_CLOSURE_SIZE(func);
        SQClosure *nc=(SQClosure*)SQ_MALLOC(size);
        new (nc) SQClosure(ss,func);
        nc->_outervalues = (SQObjectPtr *)(nc + 1);
        nc->_defaultparams = &nc->_outervalues[func->_noutervalues];
        nc->_root = root;
         __ObjAddRef(nc->_root);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_noutervalues,nc->_outervalues);
        _CONSTRUCT_VECTOR(SQObjectPtr,func->_ndefaultparams,nc->_defaultparams);
        return nc;
    }